

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

bool __thiscall QHostAddress::isEqual(QHostAddress *this,QHostAddress *other,ConversionMode mode)

{
  char cVar1;
  byte bVar2;
  QHostAddressPrivate *pQVar3;
  QHostAddressPrivate *pQVar4;
  bool bVar5;
  quint32 qVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  quint32 a4_1;
  quint32 a4;
  quint32 local_20;
  quint32 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (other->d).d.ptr;
  pQVar4 = (this->d).d.ptr;
  if (pQVar4 == pQVar3) {
    bVar5 = true;
    goto LAB_001ac707;
  }
  cVar1 = pQVar4->protocol;
  if (cVar1 == '\x02') {
    if (((uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
               super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 4) != 0) {
      if (pQVar3->protocol == '\x01') {
        if ((pQVar3->field_1).a6_64.c[0] == 0) {
          bVar5 = (pQVar3->field_1).a6_64.c[1] == 0;
          goto LAB_001ac707;
        }
        goto LAB_001ac705;
      }
      if (pQVar3->protocol == '\0') {
        bVar5 = pQVar3->a == 0;
        goto LAB_001ac707;
      }
    }
LAB_001ac6c0:
    bVar5 = cVar1 == pQVar3->protocol;
  }
  else {
    if (cVar1 == '\x01') {
      bVar2 = pQVar3->protocol;
      if (bVar2 < 2) {
        if (bVar2 != 0) {
          if (bVar2 == 1) {
            auVar7[0] = -((pQVar3->field_1).a6.c[0] == (pQVar4->field_1).a6.c[0]);
            auVar7[1] = -((pQVar3->field_1).a6.c[1] == (pQVar4->field_1).a6.c[1]);
            auVar7[2] = -((pQVar3->field_1).a6.c[2] == (pQVar4->field_1).a6.c[2]);
            auVar7[3] = -((pQVar3->field_1).a6.c[3] == (pQVar4->field_1).a6.c[3]);
            auVar7[4] = -((pQVar3->field_1).a6.c[4] == (pQVar4->field_1).a6.c[4]);
            auVar7[5] = -((pQVar3->field_1).a6.c[5] == (pQVar4->field_1).a6.c[5]);
            auVar7[6] = -((pQVar3->field_1).a6.c[6] == (pQVar4->field_1).a6.c[6]);
            auVar7[7] = -((pQVar3->field_1).a6.c[7] == (pQVar4->field_1).a6.c[7]);
            auVar7[8] = -((pQVar3->field_1).a6.c[8] == (pQVar4->field_1).a6.c[8]);
            auVar7[9] = -((pQVar3->field_1).a6.c[9] == (pQVar4->field_1).a6.c[9]);
            auVar7[10] = -((pQVar3->field_1).a6.c[10] == (pQVar4->field_1).a6.c[10]);
            auVar7[0xb] = -((pQVar3->field_1).a6.c[0xb] == (pQVar4->field_1).a6.c[0xb]);
            auVar7[0xc] = -((pQVar3->field_1).a6.c[0xc] == (pQVar4->field_1).a6.c[0xc]);
            auVar7[0xd] = -((pQVar3->field_1).a6.c[0xd] == (pQVar4->field_1).a6.c[0xd]);
            auVar7[0xe] = -((pQVar3->field_1).a6.c[0xe] == (pQVar4->field_1).a6.c[0xe]);
            auVar7[0xf] = -((pQVar3->field_1).a6.c[0xf] == (pQVar4->field_1).a6.c[0xf]);
            bVar5 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar7[0xf] >> 7) << 0xf) == 0xffff;
            goto LAB_001ac707;
          }
          goto LAB_001ac6c0;
        }
        local_20 = 0xaaaaaaaa;
        bVar5 = convertToIpv4(&local_20,&(pQVar4->field_1).a6,mode);
        qVar6 = local_20;
        if (bVar5) goto LAB_001ac6ed;
      }
      else if (bVar2 == 2) {
        if ((((uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
                    super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 4) != 0) &&
           ((pQVar4->field_1).a6_64.c[0] == 0)) {
          bVar5 = (pQVar4->field_1).a6_64.c[1] == 0;
          goto LAB_001ac707;
        }
      }
      else {
LAB_001ac6b8:
        if (bVar2 != 0xff) goto LAB_001ac6c0;
      }
    }
    else {
      if (cVar1 != '\0') goto LAB_001ac6c0;
      bVar2 = pQVar3->protocol;
      if (bVar2 < 2) {
        if (bVar2 == 0) {
          qVar6 = pQVar4->a;
LAB_001ac6ed:
          bVar5 = qVar6 == pQVar3->a;
          goto LAB_001ac707;
        }
        if (bVar2 != 1) goto LAB_001ac6c0;
        local_1c = 0xaaaaaaaa;
        bVar5 = convertToIpv4(&local_1c,&(pQVar3->field_1).a6,mode);
        if (bVar5) {
          bVar5 = local_1c == pQVar4->a;
          goto LAB_001ac707;
        }
      }
      else {
        if (bVar2 != 2) goto LAB_001ac6b8;
        if (((uint)mode.super_QFlagsStorageHelper<QHostAddress::ConversionModeFlag,_4>.
                   super_QFlagsStorage<QHostAddress::ConversionModeFlag>.i & 4) != 0) {
          bVar5 = pQVar4->a == 0;
          goto LAB_001ac707;
        }
      }
    }
LAB_001ac705:
    bVar5 = false;
  }
LAB_001ac707:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QHostAddress::isEqual(const QHostAddress &other, ConversionMode mode) const
{
    if (d == other.d)
        return true;

    if (d->protocol == QHostAddress::IPv4Protocol) {
        switch (other.d->protocol) {
        case QHostAddress::IPv4Protocol:
            return d->a == other.d->a;
        case QHostAddress::IPv6Protocol:
            quint32 a4;
            return convertToIpv4(a4, other.d->a6, mode) && (a4 == d->a);
        case QHostAddress::AnyIPProtocol:
            return (mode & QHostAddress::ConvertUnspecifiedAddress) && d->a == 0;
        case QHostAddress::UnknownNetworkLayerProtocol:
            return false;
        }
    }

    if (d->protocol == QHostAddress::IPv6Protocol) {
        switch (other.d->protocol) {
        case QHostAddress::IPv4Protocol:
            quint32 a4;
            return convertToIpv4(a4, d->a6, mode) && (a4 == other.d->a);
        case QHostAddress::IPv6Protocol:
            return memcmp(&d->a6, &other.d->a6, sizeof(Q_IPV6ADDR)) == 0;
        case QHostAddress::AnyIPProtocol:
            return (mode & QHostAddress::ConvertUnspecifiedAddress)
                    && (d->a6_64.c[0] == 0) && (d->a6_64.c[1] == 0);
        case QHostAddress::UnknownNetworkLayerProtocol:
            return false;
        }
    }

    if ((d->protocol == QHostAddress::AnyIPProtocol)
            && (mode & QHostAddress::ConvertUnspecifiedAddress)) {
        switch (other.d->protocol) {
        case QHostAddress::IPv4Protocol:
            return other.d->a == 0;
        case QHostAddress::IPv6Protocol:
            return (other.d->a6_64.c[0] == 0) && (other.d->a6_64.c[1] == 0);
        default:
            break;
        }
    }

    return d->protocol == other.d->protocol;
}